

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_2> tcu::normalize<double,2>(Vector<double,_2> *a)

{
  double dVar1;
  double dVar2;
  Vector<double,_2> *res;
  double *in_RDI;
  double dVar3;
  Vector<double,_2> VVar4;
  
  dVar3 = 1.0 / SQRT(a->m_data[1] * a->m_data[1] + a->m_data[0] * a->m_data[0] + 0.0);
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  dVar1 = a->m_data[0];
  dVar2 = a->m_data[1];
  VVar4.m_data[1] = dVar3 * dVar1;
  *in_RDI = VVar4.m_data[1];
  in_RDI[1] = dVar3 * dVar2;
  VVar4.m_data[0] = dVar1;
  return (Vector<double,_2>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}